

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloorCaseInstance::compare
          (FloorCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  int iVar8;
  uint uVar9;
  deUint32 aBits;
  ostringstream *poVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  deUint32 u32;
  float fVar16;
  float fVar17;
  float fVar18;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar6 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar9 - 1 < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    lVar14 = 0;
    do {
      local_34.value = floorf(*(float *)((long)pvVar3 + lVar14 * 4));
      fVar16 = *(float *)((long)pvVar4 + lVar14 * 4);
      uVar12 = (int)local_34.value - (int)fVar16;
      if ((uint)local_34.value < (uint)fVar16) {
        uVar12 = -((int)local_34.value - (int)fVar16);
      }
      if (uVar12 != 0) {
        poVar10 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
        poVar7 = anon_unknown_0::operator<<(poVar7,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
LAB_00837362:
        local_40.value = (deUint64)uVar12;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar7);
        return false;
      }
      lVar14 = lVar14 + 1;
    } while (uVar6 != (uint)lVar14);
  }
  else {
    uVar9 = -1 << (0x17 - (&DAT_00b5844c)[(ulong)uVar9 * 4] & 0x1f);
    if ((int)uVar6 < 1) {
      return true;
    }
    uVar12 = ~uVar9;
    fVar16 = (float)(uVar9 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar15 = 0;
    do {
      fVar18 = *(float *)((long)pvVar3 + uVar15 * 4);
      fVar1 = *(float *)((long)pvVar4 + uVar15 * 4);
      fVar17 = floorf(fVar18 - fVar16);
      iVar11 = (int)fVar17;
      fVar18 = floorf(fVar18 + fVar16);
      iVar13 = (int)fVar18;
      if (iVar13 < iVar11) {
LAB_00837266:
        poVar10 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = [",5);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] with ULP threshold ",0x15);
        goto LAB_00837362;
      }
      bVar5 = false;
      iVar8 = iVar11;
      do {
        fVar18 = (float)iVar8;
        uVar9 = (int)fVar18 - (int)fVar1;
        if ((uint)fVar18 < (uint)fVar1) {
          uVar9 = -((int)fVar18 - (int)fVar1);
        }
        if (uVar9 <= uVar12) {
          bVar5 = true;
          break;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 <= iVar13);
      if (!bVar5) goto LAB_00837266;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFloor(in0);

				const deUint32	ulpDiff		= getUlpDiff(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatFloor(in0-eps));
				const int		maxRes		= int(deFloatFloor(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiff(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}